

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPFakeTransmitter::RTPFakeTransmitter(RTPFakeTransmitter *this,RTPMemoryManager *mgr)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject.mgr = mgr;
  timeinit = timeinit + 1;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPFakeTransmitter_00144a00;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  _M_size = 0;
  (this->destinations).super_RTPMemoryObject.mgr = mgr;
  (this->destinations).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPHashTable_00144b98;
  memset((this->destinations).table,0,0x103f8);
  (this->destinations).memorytype = 0xd;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->acceptignoreinfo).super_RTPMemoryObject.mgr = mgr;
  (this->acceptignoreinfo).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPKeyHashTable_00144bd0;
  memset((this->acceptignoreinfo).table,0,0x103f8);
  (this->acceptignoreinfo).memorytype = 0xb;
  this->init = false;
  this->created = false;
  return;
}

Assistant:

RTPFakeTransmitter::RTPFakeTransmitter(RTPMemoryManager *mgr ) : RTPTransmitter(mgr), destinations(mgr,RTPMEM_TYPE_CLASS_DESTINATIONLISTHASHELEMENT),acceptignoreinfo(mgr,RTPMEM_TYPE_CLASS_ACCEPTIGNOREHASHELEMENT)
{
	created = false;
	init = false;
}